

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

JavascriptArray *
Js::JavascriptObject::CreateKeysHelper
          (RecyclableObject *object,ScriptContext *scriptContext,BOOL includeNonEnumerable,
          bool includeSymbolProperties,bool includeStringProperties,bool includeSpecialProperties)

{
  code *pcVar1;
  JavascriptString *value;
  EnumeratorCache *pEVar2;
  bool bVar3;
  int iVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  JavascriptLibrary *pJVar7;
  Type *type;
  PropertyRecord *this;
  JavascriptSymbol *newValue;
  ScriptContext *objectScriptContext;
  Var newValue_00;
  undefined4 extraout_var;
  uint local_c4;
  uint32 symIndex;
  uint32 totalSymbols;
  uint32 index;
  JavascriptArray *newArrForSymbols;
  JavascriptSymbol *symbol;
  PropertyRecord *propertyRecord;
  uint32 local_98;
  uint32 symbolIndex;
  uint32 propertyIndex;
  PropertyId propertyId;
  JavascriptString *propertyName;
  EnumeratorCache *cache;
  JavascriptArray *newArr;
  undefined1 local_70 [7];
  EnumeratorFlags flags;
  JavascriptStaticEnumerator enumerator;
  bool includeSpecialProperties_local;
  bool includeStringProperties_local;
  bool includeSymbolProperties_local;
  BOOL includeNonEnumerable_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *object_local;
  
  enumerator.arrayEnumerator.ptr._1_1_ = includeSpecialProperties;
  enumerator.arrayEnumerator.ptr._2_1_ = includeStringProperties;
  enumerator.arrayEnumerator.ptr._3_1_ = includeSymbolProperties;
  enumerator.arrayEnumerator.ptr._4_4_ = includeNonEnumerable;
  if ((!includeStringProperties) && (!includeSymbolProperties)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x4cc,"(includeStringProperties || includeSymbolProperties)",
                                "Should either get string or symbol properties.");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  JavascriptStaticEnumerator::JavascriptStaticEnumerator((JavascriptStaticEnumerator *)local_70);
  newArr._7_1_ = operator|(SnapShotSemantics,UseCache);
  pJVar7 = ScriptContext::GetLibrary(scriptContext);
  cache = (EnumeratorCache *)JavascriptLibrary::CreateArray(pJVar7,0);
  if (enumerator.arrayEnumerator.ptr._4_4_ != 0) {
    operator|=((EnumeratorFlags *)((long)&newArr + 7),EnumNonEnumerable);
  }
  if ((enumerator.arrayEnumerator.ptr._3_1_ & 1) != 0) {
    operator|=((EnumeratorFlags *)((long)&newArr + 7),EnumSymbols);
  }
  pJVar7 = ScriptContext::GetLibrary(scriptContext);
  type = RecyclableObject::GetType(object);
  propertyName = (JavascriptString *)JavascriptLibrary::GetCreateKeysCache(pJVar7,type);
  iVar4 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x2b])
                    (object,local_70,(ulong)newArr._7_1_,scriptContext,propertyName);
  if (iVar4 == 0) {
    object_local = (RecyclableObject *)cache;
  }
  else {
    _propertyIndex = (JavascriptString *)0x0;
    local_98 = 0;
    propertyRecord._4_4_ = 0;
    _totalSymbols = (JavascriptArray *)0x0;
LAB_012d5771:
    _propertyIndex =
         JavascriptStaticEnumerator::MoveAndGetNext
                   ((JavascriptStaticEnumerator *)local_70,(PropertyId *)&symbolIndex,
                    (PropertyAttributes *)0x0);
    if (_propertyIndex != (JavascriptString *)0x0) {
      if (_propertyIndex != (JavascriptString *)0x0) {
        if ((enumerator.arrayEnumerator.ptr._3_1_ & 1) != 0) {
          this = ScriptContext::GetPropertyName(scriptContext,symbolIndex);
          bVar3 = PropertyRecord::IsSymbol(this);
          if (bVar3) {
            newValue = ScriptContext::GetSymbol(scriptContext,this);
            if (_totalSymbols == (JavascriptArray *)0x0) {
              pJVar7 = ScriptContext::GetLibrary(scriptContext);
              _totalSymbols = JavascriptLibrary::CreateArray(pJVar7,0);
            }
            Js::JavascriptArray::DirectSetItemAt<Js::JavascriptSymbol*>
                      (_totalSymbols,propertyRecord._4_4_,newValue);
            propertyRecord._4_4_ = propertyRecord._4_4_ + 1;
            goto LAB_012d5771;
          }
        }
        pEVar2 = cache;
        value = _propertyIndex;
        if ((enumerator.arrayEnumerator.ptr._2_1_ & 1) != 0) {
          objectScriptContext =
               RecyclableObject::GetScriptContext(&_propertyIndex->super_RecyclableObject);
          newValue_00 = CrossSite::MarshalVar(scriptContext,value,objectScriptContext);
          Js::JavascriptArray::DirectSetItemAt<void*>
                    ((JavascriptArray *)pEVar2,local_98,newValue_00);
          local_98 = local_98 + 1;
        }
      }
      goto LAB_012d5771;
    }
    _propertyIndex = (JavascriptString *)0x0;
    if (((enumerator.arrayEnumerator.ptr._1_1_ & 1) != 0) &&
       ((enumerator.arrayEnumerator.ptr._2_1_ & 1) != 0)) {
      symIndex = 0;
      while (iVar4 = (*(object->super_FinalizableObject).super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject[0x3f])
                               (object,(ulong)symIndex,&propertyIndex,scriptContext), iVar4 != 0) {
        Js::JavascriptArray::DirectSetItemAt<Js::JavascriptString*>
                  ((JavascriptArray *)cache,local_98,_propertyIndex);
        symIndex = symIndex + 1;
        local_98 = local_98 + 1;
      }
    }
    if (_totalSymbols != (JavascriptArray *)0x0) {
      uVar5 = ArrayObject::GetLength(&_totalSymbols->super_ArrayObject);
      for (local_c4 = 0; pEVar2 = cache, local_c4 < uVar5; local_c4 = local_c4 + 1) {
        iVar4 = (*(_totalSymbols->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x72])(_totalSymbols,(ulong)local_c4);
        Js::JavascriptArray::DirectSetItemAt<void*>
                  ((JavascriptArray *)pEVar2,local_98,(Var)CONCAT44(extraout_var,iVar4));
        local_98 = local_98 + 1;
      }
    }
    object_local = (RecyclableObject *)cache;
  }
  return (JavascriptArray *)object_local;
}

Assistant:

JavascriptArray* JavascriptObject::CreateKeysHelper(RecyclableObject* object, ScriptContext* scriptContext, BOOL includeNonEnumerable, bool includeSymbolProperties, bool includeStringProperties, bool includeSpecialProperties)
{
    //1. Let keys be a new empty List.
    //2. For each own property key P of O that is an integer index, in ascending numeric index order
    //      a. Add P as the last element of keys.
    //3. For each own property key P of O that is a String but is not an integer index, in property creation order
    //      a. Add P as the last element of keys.
    //4. For each own property key P of O that is a Symbol, in property creation order
    //      a. Add P as the last element of keys.
    //5. Return keys.
    AssertMsg(includeStringProperties || includeSymbolProperties, "Should either get string or symbol properties.");

    JavascriptStaticEnumerator enumerator;
    EnumeratorFlags flags = EnumeratorFlags::SnapShotSemantics | EnumeratorFlags::UseCache;
    JavascriptArray* newArr = scriptContext->GetLibrary()->CreateArray(0);
    if (includeNonEnumerable)
    {
        flags |= EnumeratorFlags::EnumNonEnumerable;
    }
    if (includeSymbolProperties)
    {
        flags |= EnumeratorFlags::EnumSymbols;
    }
    EnumeratorCache* cache = scriptContext->GetLibrary()->GetCreateKeysCache(object->GetType());
    if (!object->GetEnumerator(&enumerator, flags, scriptContext, cache))
    {
        return newArr;  // Return an empty array if we don't have an enumerator
    }

    JavascriptString * propertyName = nullptr;
    PropertyId propertyId;
    uint32 propertyIndex = 0;
    uint32 symbolIndex = 0;
    const PropertyRecord* propertyRecord;
    JavascriptSymbol* symbol;
    JavascriptArray* newArrForSymbols = nullptr;
    while ((propertyName = enumerator.MoveAndGetNext(propertyId)) != NULL)
    {
        if (propertyName)
        {
            if (includeSymbolProperties)
            {
                propertyRecord = scriptContext->GetPropertyName(propertyId);

                if (propertyRecord->IsSymbol())
                {
                    symbol = scriptContext->GetSymbol(propertyRecord);
                    // no need to marshal symbol because it is created from scriptContext
                    if (!newArrForSymbols)
                    {
                        newArrForSymbols = scriptContext->GetLibrary()->CreateArray(0);
                    }
                    newArrForSymbols->DirectSetItemAt(symbolIndex++, symbol);
                    continue;
                }
            }
            if (includeStringProperties)
            {
                newArr->DirectSetItemAt(propertyIndex++, CrossSite::MarshalVar(scriptContext, propertyName, propertyName->GetScriptContext()));
            }
        }
    }

    // Special properties
    if (includeSpecialProperties && includeStringProperties)
    {
        uint32 index = 0;
        while (object->GetSpecialPropertyName(index, &propertyName, scriptContext))
        {
            newArr->DirectSetItemAt(propertyIndex++, propertyName);
            index++;
        }
    }

    if (newArrForSymbols)
    {
        // Append all the symbols at the end of list
        uint32 totalSymbols = newArrForSymbols->GetLength();
        for (uint32 symIndex = 0; symIndex < totalSymbols; symIndex++)
        {
            newArr->DirectSetItemAt(propertyIndex++, newArrForSymbols->DirectGetItem(symIndex));
        }
    }

    return newArr;
}